

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O0

optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_> *
miniscript::internal::ParseHexStrEnd<(anonymous_namespace)::KeyConverter>
          (Span<const_char> in,size_t expected_size,KeyConverter *ctx)

{
  Span<const_char> sp;
  string_view str;
  string_view hex_str;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  char *pcVar2;
  size_type sVar3;
  size_type in_RCX;
  optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  int hash_size;
  string val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar5;
  char *in_stack_fffffffffffffef0;
  allocator<char> *__a;
  size_t in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *pcVar6;
  char *in_stack_ffffffffffffff48;
  undefined1 local_71 [105];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  sp.m_size = in_stack_fffffffffffffef8;
  sp.m_data = in_stack_fffffffffffffef0;
  local_71._21_4_ = FindNextChar(sp,(char)((uint)in_stack_fffffffffffffee8 >> 0x18));
  if ((int)local_71._21_4_ < 1) {
    std::optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>::
    optional((optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
              *)in_stack_fffffffffffffed8);
  }
  else {
    __a = (allocator<char> *)(local_71 + 0x19);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffed8);
    pcVar2 = Span<const_char>::begin((Span<const_char> *)in_stack_fffffffffffffed8);
    pcVar2 = pcVar2 + (int)local_71._21_4_;
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>(this_00,pcVar2,(char *)this,__a);
    std::allocator<char>::~allocator((allocator<char> *)local_71);
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
    pcVar6 = _Var4._M_str;
    str._M_str = (char *)this_00;
    str._M_len = (size_t)pcVar2;
    bVar1 = IsHex(str);
    uVar5 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
    if (bVar1) {
      std::__cxx11::string::operator_cast_to_basic_string_view(this);
      hex_str._M_str = in_stack_ffffffffffffff48;
      hex_str._M_len = (size_t)pcVar6;
      ParseHex<unsigned_char>(hex_str);
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffed8);
      if (sVar3 == in_RCX) {
        std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>::
        pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int_&,_true>
                  ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                   CONCAT44(uVar5,in_stack_fffffffffffffee8),&in_stack_fffffffffffffee0->first,
                   (int *)in_stack_fffffffffffffed8);
        std::optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>::
        optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>,_true>
                  ((optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
                    *)CONCAT44(uVar5,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0);
        std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>::~pair
                  ((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int> *)
                   in_stack_fffffffffffffed8);
      }
      else {
        std::optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>::
        optional((optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
                  *)in_stack_fffffffffffffed8);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(uVar5,in_stack_fffffffffffffee8));
    }
    else {
      std::optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>::
      optional((optional<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_int>_>
                *)in_stack_fffffffffffffed8);
    }
    std::__cxx11::string::~string(in_stack_fffffffffffffed8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<std::vector<unsigned char>, int>> ParseHexStrEnd(Span<const char> in, const size_t expected_size,
                                                                         const Ctx& ctx)
{
    int hash_size = FindNextChar(in, ')');
    if (hash_size < 1) return {};
    std::string val = std::string(in.begin(), in.begin() + hash_size);
    if (!IsHex(val)) return {};
    auto hash = ParseHex(val);
    if (hash.size() != expected_size) return {};
    return {{std::move(hash), hash_size}};
}